

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O1

void __thiscall Liby::Buffer::prepend(Buffer *this,char *buf,off_t len)

{
  long lVar1;
  off_t oVar2;
  off_t oVar3;
  off_t oVar4;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  Buffer nb;
  Buffer local_48;
  
  if ((buf != (char *)0x0) && (0 < len)) {
    lVar1 = this->leftIndex_;
    if (len - lVar1 != 0 && lVar1 <= len) {
      if (this->rightIndex_ < lVar1) {
        __assert_fail("rightIndex_ >= leftIndex_",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                      ,0x5a,"off_t Liby::Buffer::size() const");
      }
      uVar5 = (this->rightIndex_ - lVar1) + len;
      if (this->capacity_ < (long)uVar5) {
        local_48.buffer_ = (char *)0x0;
        local_48.leftIndex_ = 0;
        local_48.rightIndex_ = 0;
        uVar7 = 0xffffffffffffffff;
        if (-1 < (long)uVar5) {
          uVar7 = uVar5;
        }
        local_48.capacity_ = uVar5;
        local_48.buffer_ = (char *)operator_new__(uVar7);
        append(&local_48,this);
        pcVar6 = this->buffer_;
        this->buffer_ = local_48.buffer_;
        oVar2 = this->leftIndex_;
        this->leftIndex_ = local_48.leftIndex_;
        oVar3 = this->rightIndex_;
        this->rightIndex_ = local_48.rightIndex_;
        oVar4 = this->capacity_;
        this->capacity_ = local_48.capacity_;
        local_48.buffer_ = pcVar6;
        local_48.leftIndex_ = oVar2;
        local_48.rightIndex_ = oVar3;
        local_48.capacity_ = oVar4;
        if (pcVar6 != (char *)0x0) {
          operator_delete__(pcVar6);
          local_48.buffer_ = (char *)0x0;
        }
      }
      else {
        backward(this,len - lVar1);
      }
    }
    pcVar6 = data(this);
    memcpy(pcVar6 + -len,buf,len);
    this->leftIndex_ = this->leftIndex_ - len;
    return;
  }
  __assert_fail("buf && len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Buffer.cpp"
                ,0x8f,"void Liby::Buffer::prepend(const char *, off_t)");
}

Assistant:

void Buffer::prepend(const char *buf, off_t len) {
    assert(buf && len > 0);
    if (leftIndex_ >= len) {
        ;
    } else if (len + size() <= capacity_) {
        backward(len - leftIndex_);
    } else {
        Buffer nb(len + size());
        nb.append(*this);
        swap(nb);
    }
    safePreappend(buf, len);
}